

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

TValue * lj_meta_equal(lua_State *L,GCobj *o1,GCobj *o2,int ne)

{
  int iVar1;
  uint uVar2;
  undefined8 *puVar3;
  int in_ECX;
  code *pcVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  cTValue *mo2;
  uint32_t it;
  TValue *top;
  cTValue *mo;
  GCstr *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  MMS mm;
  GCtab *in_stack_ffffffffffffff48;
  cTValue *o2_00;
  cTValue *local_b0;
  cTValue *local_a8;
  TValue *local_60;
  
  mm = (MMS)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  if (*(int *)(in_RSI + 0x10) == 0) {
    local_a8 = (cTValue *)0x0;
  }
  else {
    if ((*(byte *)((ulong)*(uint *)(in_RSI + 0x10) + 6) & 0x10) == 0) {
      local_b0 = lj_meta_cache(in_stack_ffffffffffffff48,mm,in_stack_ffffffffffffff38);
    }
    else {
      local_b0 = (cTValue *)0x0;
    }
    local_a8 = local_b0;
  }
  if (local_a8 == (cTValue *)0x0) {
    local_60 = (TValue *)(long)in_ECX;
  }
  else {
    if (*(int *)(in_RSI + 0x10) != *(int *)(in_RDX + 0x10)) {
      if (*(int *)(in_RDX + 0x10) == 0) {
        o2_00 = (cTValue *)0x0;
      }
      else if ((*(byte *)((ulong)*(uint *)(in_RDX + 0x10) + 6) & 0x10) == 0) {
        o2_00 = lj_meta_cache(in_stack_ffffffffffffff48,mm,in_stack_ffffffffffffff38);
      }
      else {
        o2_00 = (cTValue *)0x0;
      }
      if ((o2_00 == (cTValue *)0x0) || (iVar1 = lj_obj_equal(local_a8,o2_00), iVar1 == 0)) {
        return (TValue *)(long)in_ECX;
      }
    }
    if (*(char *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8) + 6) == '\0') {
      puVar3 = (undefined8 *)
               (*(long *)(in_RDI + 0x10) +
               (long)(int)(uint)*(byte *)((ulong)*(uint *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10)
                                                                           + -8) + 0x10) - 0x39) * 8
               );
    }
    else {
      puVar3 = *(undefined8 **)(in_RDI + 0x18);
    }
    pcVar4 = lj_cont_condt;
    if (in_ECX != 0) {
      pcVar4 = lj_cont_condf;
    }
    *puVar3 = pcVar4 + -0x19c020;
    *(cTValue *)(puVar3 + 1) = *local_a8;
    uVar2 = *(byte *)(in_RSI + 5) ^ 0xffffffff;
    *(int *)(puVar3 + 2) = (int)in_RSI;
    *(uint *)((long)puVar3 + 0x14) = uVar2;
    *(int *)(puVar3 + 3) = (int)in_RDX;
    *(uint *)((long)puVar3 + 0x1c) = uVar2;
    local_60 = (TValue *)(puVar3 + 2);
  }
  return local_60;
}

Assistant:

TValue *lj_meta_equal(lua_State *L, GCobj *o1, GCobj *o2, int ne)
{
  /* Field metatable must be at same offset for GCtab and GCudata! */
  cTValue *mo = lj_meta_fast(L, tabref(o1->gch.metatable), MM_eq);
  if (mo) {
    TValue *top;
    uint32_t it;
    if (tabref(o1->gch.metatable) != tabref(o2->gch.metatable)) {
      cTValue *mo2 = lj_meta_fast(L, tabref(o2->gch.metatable), MM_eq);
      if (mo2 == NULL || !lj_obj_equal(mo, mo2))
	return (TValue *)(intptr_t)ne;
    }
    top = curr_top(L);
    setcont(top, ne ? lj_cont_condf : lj_cont_condt);
    copyTV(L, top+1, mo);
    it = ~(uint32_t)o1->gch.gct;
    setgcV(L, top+2, o1, it);
    setgcV(L, top+3, o2, it);
    return top+2;  /* Trigger metamethod call. */
  }
  return (TValue *)(intptr_t)ne;
}